

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_inverse(matrix4 *self,matrix4 *mR)

{
  short sVar1;
  double f1;
  byte local_a9;
  uint8_t i;
  double determinant;
  matrix4 inverse;
  matrix4 *mR_local;
  matrix4 *self_local;
  
  inverse.field_0.m[0xf] = (double)mR;
  f1 = matrix4_determinant(self);
  sVar1 = scalar_equalsf(f1,0.0);
  if (sVar1 == 0) {
    matrix4_identity((matrix4 *)&determinant);
    determinant = -((self->field_0).m[7] * (self->field_0).m[10]) * (self->field_0).m[0xd] +
                  -((self->field_0).m[6] * (self->field_0).m[9]) * (self->field_0).m[0xf] +
                  -((self->field_0).m[5] * (self->field_0).m[0xb]) * (self->field_0).m[0xe] +
                  (self->field_0).m[7] * (self->field_0).m[9] * (self->field_0).m[0xe] +
                  (self->field_0).m[5] * (self->field_0).m[10] * (self->field_0).m[0xf] +
                  (self->field_0).m[6] * (self->field_0).m[0xb] * (self->field_0).m[0xd];
    inverse.field_0.m[0] =
         -((self->field_0).m[3] * (self->field_0).m[9]) * (self->field_0).m[0xe] +
         -((self->field_0).m[2] * (self->field_0).m[0xb]) * (self->field_0).m[0xd] +
         -((self->field_0).m[1] * (self->field_0).m[10]) * (self->field_0).m[0xf] +
         (self->field_0).m[3] * (self->field_0).m[10] * (self->field_0).m[0xd] +
         (self->field_0).m[1] * (self->field_0).m[0xb] * (self->field_0).m[0xe] +
         (self->field_0).m[2] * (self->field_0).m[9] * (self->field_0).m[0xf];
    inverse.field_0.m[1] =
         -((self->field_0).m[3] * (self->field_0).m[6]) * (self->field_0).m[0xd] +
         -((self->field_0).m[2] * (self->field_0).m[5]) * (self->field_0).m[0xf] +
         -((self->field_0).m[1] * (self->field_0).m[7]) * (self->field_0).m[0xe] +
         (self->field_0).m[3] * (self->field_0).m[5] * (self->field_0).m[0xe] +
         (self->field_0).m[1] * (self->field_0).m[6] * (self->field_0).m[0xf] +
         (self->field_0).m[2] * (self->field_0).m[7] * (self->field_0).m[0xd];
    inverse.field_0.m[2] =
         -((self->field_0).m[3] * (self->field_0).m[5]) * (self->field_0).m[10] +
         -((self->field_0).m[2] * (self->field_0).m[7]) * (self->field_0).m[9] +
         -((self->field_0).m[1] * (self->field_0).m[6]) * (self->field_0).m[0xb] +
         (self->field_0).m[3] * (self->field_0).m[6] * (self->field_0).m[9] +
         (self->field_0).m[1] * (self->field_0).m[7] * (self->field_0).m[10] +
         (self->field_0).m[2] * (self->field_0).m[5] * (self->field_0).m[0xb];
    inverse.field_0.m[3] =
         -((self->field_0).m[7] * (self->field_0).m[8]) * (self->field_0).m[0xe] +
         -((self->field_0).m[6] * (self->field_0).m[0xb]) * (self->field_0).m[0xc] +
         -((self->field_0).m[4] * (self->field_0).m[10]) * (self->field_0).m[0xf] +
         (self->field_0).m[7] * (self->field_0).m[10] * (self->field_0).m[0xc] +
         (self->field_0).m[4] * (self->field_0).m[0xb] * (self->field_0).m[0xe] +
         (self->field_0).m[6] * (self->field_0).m[8] * (self->field_0).m[0xf];
    inverse.field_0.m[4] =
         -((self->field_0).m[3] * (self->field_0).m[10]) * (self->field_0).m[0xc] +
         -((self->field_0).m[2] * (self->field_0).m[8]) * (self->field_0).m[0xf] +
         -((self->field_0).m[0] * (self->field_0).m[0xb]) * (self->field_0).m[0xe] +
         (self->field_0).m[3] * (self->field_0).m[8] * (self->field_0).m[0xe] +
         (self->field_0).m[0] * (self->field_0).m[10] * (self->field_0).m[0xf] +
         (self->field_0).m[2] * (self->field_0).m[0xb] * (self->field_0).m[0xc];
    inverse.field_0.m[5] =
         -((self->field_0).m[3] * (self->field_0).m[4]) * (self->field_0).m[0xe] +
         -((self->field_0).m[2] * (self->field_0).m[7]) * (self->field_0).m[0xc] +
         -((self->field_0).m[0] * (self->field_0).m[6]) * (self->field_0).m[0xf] +
         (self->field_0).m[3] * (self->field_0).m[6] * (self->field_0).m[0xc] +
         (self->field_0).m[0] * (self->field_0).m[7] * (self->field_0).m[0xe] +
         (self->field_0).m[2] * (self->field_0).m[4] * (self->field_0).m[0xf];
    inverse.field_0.m[6] =
         -((self->field_0).m[3] * (self->field_0).m[6]) * (self->field_0).m[8] +
         -((self->field_0).m[2] * (self->field_0).m[4]) * (self->field_0).m[0xb] +
         -((self->field_0).m[0] * (self->field_0).m[7]) * (self->field_0).m[10] +
         (self->field_0).m[3] * (self->field_0).m[4] * (self->field_0).m[10] +
         (self->field_0).m[0] * (self->field_0).m[6] * (self->field_0).m[0xb] +
         (self->field_0).m[2] * (self->field_0).m[7] * (self->field_0).m[8];
    inverse.field_0.m[7] =
         -((self->field_0).m[7] * (self->field_0).m[9]) * (self->field_0).m[0xc] +
         -((self->field_0).m[5] * (self->field_0).m[8]) * (self->field_0).m[0xf] +
         -((self->field_0).m[4] * (self->field_0).m[0xb]) * (self->field_0).m[0xd] +
         (self->field_0).m[7] * (self->field_0).m[8] * (self->field_0).m[0xd] +
         (self->field_0).m[4] * (self->field_0).m[9] * (self->field_0).m[0xf] +
         (self->field_0).m[5] * (self->field_0).m[0xb] * (self->field_0).m[0xc];
    inverse.field_0.m[8] =
         -((self->field_0).m[3] * (self->field_0).m[8]) * (self->field_0).m[0xd] +
         -((self->field_0).m[1] * (self->field_0).m[0xb]) * (self->field_0).m[0xc] +
         -((self->field_0).m[0] * (self->field_0).m[9]) * (self->field_0).m[0xf] +
         (self->field_0).m[3] * (self->field_0).m[9] * (self->field_0).m[0xc] +
         (self->field_0).m[0] * (self->field_0).m[0xb] * (self->field_0).m[0xd] +
         (self->field_0).m[1] * (self->field_0).m[8] * (self->field_0).m[0xf];
    inverse.field_0.m[9] =
         -((self->field_0).m[3] * (self->field_0).m[5]) * (self->field_0).m[0xc] +
         -((self->field_0).m[1] * (self->field_0).m[4]) * (self->field_0).m[0xf] +
         -((self->field_0).m[0] * (self->field_0).m[7]) * (self->field_0).m[0xd] +
         (self->field_0).m[3] * (self->field_0).m[4] * (self->field_0).m[0xd] +
         (self->field_0).m[0] * (self->field_0).m[5] * (self->field_0).m[0xf] +
         (self->field_0).m[1] * (self->field_0).m[7] * (self->field_0).m[0xc];
    inverse.field_0.m[10] =
         -((self->field_0).m[3] * (self->field_0).m[4]) * (self->field_0).m[9] +
         -((self->field_0).m[1] * (self->field_0).m[7]) * (self->field_0).m[8] +
         -((self->field_0).m[0] * (self->field_0).m[5]) * (self->field_0).m[0xb] +
         (self->field_0).m[3] * (self->field_0).m[5] * (self->field_0).m[8] +
         (self->field_0).m[0] * (self->field_0).m[7] * (self->field_0).m[9] +
         (self->field_0).m[1] * (self->field_0).m[4] * (self->field_0).m[0xb];
    inverse.field_0.m[0xb] =
         -((self->field_0).m[6] * (self->field_0).m[8]) * (self->field_0).m[0xd] +
         -((self->field_0).m[5] * (self->field_0).m[10]) * (self->field_0).m[0xc] +
         -((self->field_0).m[4] * (self->field_0).m[9]) * (self->field_0).m[0xe] +
         (self->field_0).m[6] * (self->field_0).m[9] * (self->field_0).m[0xc] +
         (self->field_0).m[4] * (self->field_0).m[10] * (self->field_0).m[0xd] +
         (self->field_0).m[5] * (self->field_0).m[8] * (self->field_0).m[0xe];
    inverse.field_0.m[0xc] =
         -((self->field_0).m[2] * (self->field_0).m[9]) * (self->field_0).m[0xc] +
         -((self->field_0).m[1] * (self->field_0).m[8]) * (self->field_0).m[0xe] +
         -((self->field_0).m[0] * (self->field_0).m[10]) * (self->field_0).m[0xd] +
         (self->field_0).m[2] * (self->field_0).m[8] * (self->field_0).m[0xd] +
         (self->field_0).m[0] * (self->field_0).m[9] * (self->field_0).m[0xe] +
         (self->field_0).m[1] * (self->field_0).m[10] * (self->field_0).m[0xc];
    inverse.field_0.m[0xd] =
         -((self->field_0).m[2] * (self->field_0).m[4]) * (self->field_0).m[0xd] +
         -((self->field_0).m[1] * (self->field_0).m[6]) * (self->field_0).m[0xc] +
         -((self->field_0).m[0] * (self->field_0).m[5]) * (self->field_0).m[0xe] +
         (self->field_0).m[2] * (self->field_0).m[5] * (self->field_0).m[0xc] +
         (self->field_0).m[0] * (self->field_0).m[6] * (self->field_0).m[0xd] +
         (self->field_0).m[1] * (self->field_0).m[4] * (self->field_0).m[0xe];
    inverse.field_0.m[0xe] =
         -((self->field_0).m[2] * (self->field_0).m[5]) * (self->field_0).m[8] +
         -((self->field_0).m[1] * (self->field_0).m[4]) * (self->field_0).m[10] +
         -((self->field_0).m[0] * (self->field_0).m[6]) * (self->field_0).m[9] +
         (self->field_0).m[2] * (self->field_0).m[4] * (self->field_0).m[9] +
         (self->field_0).m[0] * (self->field_0).m[5] * (self->field_0).m[10] +
         (self->field_0).m[1] * (self->field_0).m[6] * (self->field_0).m[8];
    for (local_a9 = 0; local_a9 < 0x10; local_a9 = local_a9 + 1) {
      *(double *)((long)inverse.field_0.m[0xf] + (ulong)local_a9 * 8) =
           (&determinant)[local_a9] * (1.0 / f1);
    }
    self_local = (matrix4 *)inverse.field_0.m[0xf];
  }
  else {
    self_local = (matrix4 *)0x0;
  }
  return self_local;
}

Assistant:

HYPAPI struct matrix4 *matrix4_inverse(const struct matrix4 *self, struct matrix4 *mR)
{
	struct matrix4 inverse;
	HYP_FLOAT determinant;
	uint8_t i;

	determinant = matrix4_determinant(self);

	/* calculated early for a quick exit if no determinant exists */
	if (scalar_equalsf(determinant, 0.0f)) {
		return NULL;
	}

	determinant = 1.0f / determinant;

	matrix4_identity(&inverse);

	B(11) = A3(22, 33, 44) + A3(23, 34, 42) + A3(24, 32, 43) - A3(22, 34, 43) - A3(23, 32, 44) - A3(24, 33, 42);
	B(12) = A3(12, 34, 43) + A3(13, 32, 44) + A3(14, 33, 42) - A3(12, 33, 44) - A3(13, 34, 42) - A3(14, 32, 43);
	B(13) = A3(12, 23, 44) + A3(13, 24, 42) + A3(14, 22, 43) - A3(12, 24, 43) - A3(13, 22, 44) - A3(14, 23, 42);
	B(14) = A3(12, 24, 33) + A3(13, 22, 34) + A3(14, 23, 32) - A3(12, 23, 34) - A3(13, 24, 32) - A3(14, 22, 33);
	B(21) = A3(21, 34, 43) + A3(23, 31, 44) + A3(24, 33, 41) - A3(21, 33, 44) - A3(23, 34, 41) - A3(24, 31, 43);
	B(22) = A3(11, 33, 44) + A3(13, 34, 41) + A3(14, 31, 43) - A3(11, 34, 43) - A3(13, 31, 44) - A3(14, 33, 41);
	B(23) = A3(11, 24, 43) + A3(13, 21, 44) + A3(14, 23, 41) - A3(11, 23, 44) - A3(13, 24, 41) - A3(14, 21, 43);
	B(24) = A3(11, 23, 34) + A3(13, 24, 31) + A3(14, 21, 33) - A3(11, 24, 33) - A3(13, 21, 34) - A3(14, 23, 31);
	B(31) = A3(21, 32, 44) + A3(22, 34, 41) + A3(24, 31, 42) - A3(21, 34, 42) - A3(22, 31, 44) - A3(24, 32, 41);
	B(32) = A3(11, 34, 42) + A3(12, 31, 44) + A3(14, 32, 41) - A3(11, 32, 44) - A3(12, 34, 41) - A3(14, 31, 42);
	B(33) = A3(11, 22, 44) + A3(12, 24, 41) + A3(14, 21, 42) - A3(11, 24, 42) - A3(12, 21, 44) - A3(14, 22, 41);
	B(34) = A3(11, 24, 32) + A3(12, 21, 34) + A3(14, 22, 31) - A3(11, 22, 34) - A3(12, 24, 31) - A3(14, 21, 32);
	B(41) = A3(21, 33, 42) + A3(22, 31, 43) + A3(23, 32, 41) - A3(21, 32, 43) - A3(22, 33, 41) - A3(23, 31, 42);
	B(42) = A3(11, 32, 43) + A3(12, 33, 41) + A3(13, 31, 42) - A3(11, 33, 42) - A3(12, 31, 43) - A3(13, 32, 41);
	B(43) = A3(11, 23, 42) + A3(12, 21, 43) + A3(13, 22, 41) - A3(11, 22, 43) - A3(12, 23, 41) - A3(13, 21, 42);
	B(44) = A3(11, 22, 33) + A3(12, 23, 31) + A3(13, 21, 32) - A3(11, 23, 32) - A3(12, 21, 33) - A3(13, 22, 31);

	/* divide the determinant */
	for (i = 0; i < 16; i++) {
		mR->m[i] = inverse.m[i] * determinant;
	}

	return mR;
}